

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall QHostInfoCache::QHostInfoCache(QHostInfoCache *this)

{
  this->max_age = 0x3c;
  (this->enabled)._M_base._M_i = true;
  QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::QCache(&this->cache,0x80);
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  return;
}

Assistant:

QHostInfoCache::QHostInfoCache() : max_age(60), enabled(true), cache(128)
{
#ifdef QT_QHOSTINFO_CACHE_DISABLED_BY_DEFAULT
    enabled.store(false, std::memory_order_relaxed);
#endif
}